

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryBuilder::verifyInt32(WasmBinaryBuilder *this,int32_t x)

{
  uint32_t uVar1;
  string local_40;
  allocator<char> local_19;
  
  uVar1 = getInt32(this);
  if (uVar1 == x) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"surprising value",&local_19);
  throwError(this,&local_40);
}

Assistant:

void WasmBinaryBuilder::verifyInt32(int32_t x) {
  int32_t y = getInt32();
  if (x != y) {
    throwError("surprising value");
  }
}